

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::undo
          (HighsPostsolveStack *this,HighsOptions *options,HighsSolution *solution,HighsBasis *basis
          ,HighsInt report_col)

{
  vector<int,_std::allocator<int>_> *index;
  vector<int,_std::allocator<int>_> *index_00;
  HighsDataStack *this_00;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *r;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *r_00;
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  pointer pcVar4;
  ulong uVar5;
  pointer ppVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  LinearTransform reduction;
  DoubletonEquation local_88;
  vector<double,_std::allocator<double>_> *local_38;
  
  uVar5 = (ulong)(uint)report_col;
  (this->reductionValues).position =
       (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar2 = solution->dual_valid;
  bVar3 = basis->valid;
  local_38 = &solution->col_value;
  index = &this->origColIndex;
  undoIterateBackwards<double>(this,local_38,index,this->origNumCol);
  index_00 = &this->origRowIndex;
  undoIterateBackwards<double>(this,&solution->row_value,index_00,this->origNumRow);
  if (bVar2 == true) {
    undoIterateBackwards<double>(this,&solution->col_dual,index,this->origNumCol);
    undoIterateBackwards<double>(this,&solution->row_dual,index_00,this->origNumRow);
  }
  if (bVar3 != false) {
    undoIterateBackwards<HighsBasisStatus>(this,&basis->col_status,index,this->origNumCol);
    undoIterateBackwards<HighsBasisStatus>(this,&basis->row_status,index_00,this->origNumRow);
  }
  lVar7 = (long)(this->reductions).
                super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->reductions).
                super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    this_00 = &this->reductionValues;
    lVar9 = lVar7 >> 4;
    r = &this->rowValues;
    r_00 = &this->colValues;
    do {
      ppVar6 = (this->reductions).
               super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (-1 < report_col) {
        printf("Before  reduction %2d (type %2d): col_value[%2d] = %g\n",
               SUB84((local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5],0),(ulong)((int)lVar9 - 1),
               (ulong)(&ppVar6[-1].first)[lVar7],uVar5);
        ppVar6 = (this->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      switch((&ppVar6[-1].first)[lVar7]) {
      case kLinearTransform:
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x18;
        local_88.rhs = *(double *)(pcVar4 + (sVar8 - 8));
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x18));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        LinearTransform::undo((LinearTransform *)&local_88,options,solution);
        break;
      case kFreeColSubstitution:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x20;
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x20));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x10));
        local_88.rhs = *pdVar1;
        local_88.substLower = pdVar1[1];
        FreeColSubstitution::undo((FreeColSubstitution *)&local_88,options,r,r_00,solution,basis);
        break;
      case kDoubletonEquation:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        sVar8 = (this->reductionValues).position - 0x48;
        (this->reductionValues).position = sVar8;
        memcpy(&local_88,
               (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + sVar8,0x48);
        DoubletonEquation::undo(&local_88,options,r_00,solution,basis);
        break;
      case kEqualityRowAddition:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x10;
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x10));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        EqualityRowAddition::undo((EqualityRowAddition *)&local_88,options,r,solution,basis);
        break;
      case kEqualityRowAdditions:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 4;
        local_88.coef = (double)CONCAT44(local_88.coef._4_4_,*(undefined4 *)(pcVar4 + (sVar8 - 4)));
        EqualityRowAdditions::undo((EqualityRowAdditions *)&local_88,options,r,r_00,solution,basis);
        break;
      case kSingletonRow:
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x18;
        local_88.rhs = *(double *)(pcVar4 + (sVar8 - 8));
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x18));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        SingletonRow::undo((SingletonRow *)&local_88,options,solution,basis);
        break;
      case kFixedCol:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x18;
        local_88.rhs = *(double *)(pcVar4 + (sVar8 - 8));
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x18));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        FixedCol::undo((FixedCol *)&local_88,options,r_00,solution,basis);
        break;
      case kRedundantRow:
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 4;
        local_88.coef = (double)CONCAT44(local_88.coef._4_4_,*(undefined4 *)(pcVar4 + (sVar8 - 4)));
        RedundantRow::undo((RedundantRow *)&local_88,options,solution,basis);
        break;
      case kForcingRow:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x10;
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x10));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        ForcingRow::undo((ForcingRow *)&local_88,options,r,solution,basis);
        break;
      case kForcingColumn:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x18;
        local_88.rhs = *(double *)(pcVar4 + (sVar8 - 8));
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x18));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        ForcingColumn::undo((ForcingColumn *)&local_88,options,r_00,solution,basis);
        break;
      case kForcingColumnRemovedRow:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x10;
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x10));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        ForcingColumnRemovedRow::undo((ForcingColumnRemovedRow *)&local_88,options,r,solution,basis)
        ;
        break;
      case kDuplicateRow:
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x18;
        local_88.rhs = *(double *)(pcVar4 + (sVar8 - 8));
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x18));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        DuplicateRow::undo((DuplicateRow *)&local_88,options,solution,basis);
        break;
      case kDuplicateColumn:
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x38;
        local_88._48_8_ = *(undefined8 *)(pcVar4 + (sVar8 - 8));
        local_88.coef = *(double *)(pcVar4 + (sVar8 - 0x38));
        local_88.coefSubst = *(double *)((long)(pcVar4 + (sVar8 - 0x38)) + 8);
        local_88.rhs = *(double *)(pcVar4 + (sVar8 - 0x28));
        local_88.substLower = *(double *)((long)(pcVar4 + (sVar8 - 0x28)) + 8);
        local_88.substUpper = *(double *)(pcVar4 + (sVar8 - 0x18));
        local_88.substCost = *(double *)((long)(pcVar4 + (sVar8 - 0x18)) + 8);
        DuplicateColumn::undo((DuplicateColumn *)&local_88,options,solution,basis);
        break;
      case kSlackColSubstitution:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = (this->reductionValues).position;
        (this->reductionValues).position = sVar8 - 0x10;
        pdVar1 = (double *)(pcVar4 + (sVar8 - 0x10));
        local_88.coef = *pdVar1;
        local_88.coefSubst = pdVar1[1];
        SlackColSubstitution::undo((SlackColSubstitution *)&local_88,options,r,solution,basis);
        break;
      default:
        printf("Reduction case %d not handled\n");
      }
      lVar9 = lVar9 + -1;
      lVar7 = lVar7 + -0x10;
    } while (lVar9 != 0);
  }
  if (-1 < report_col) {
    printf("After last reduction: col_value[%2d] = %g\n",
           SUB84((local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5],0),uVar5);
  }
  return;
}

Assistant:

void undo(const HighsOptions& options, HighsSolution& solution,
            HighsBasis& basis, const HighsInt report_col = -1) {
    reductionValues.resetPosition();

    // Verify that undo can be performed
    assert(solution.value_valid);
    bool perform_dual_postsolve = solution.dual_valid;
    bool perform_basis_postsolve = basis.valid;

    // expand solution to original index space
    assert(origNumCol > 0);
    undoIterateBackwards(solution.col_value, origColIndex, origNumCol);

    assert(origNumRow >= 0);
    undoIterateBackwards(solution.row_value, origRowIndex, origNumRow);

    if (perform_dual_postsolve) {
      // if dual solution is given, expand dual solution and basis to original
      // index space
      undoIterateBackwards(solution.col_dual, origColIndex, origNumCol);

      undoIterateBackwards(solution.row_dual, origRowIndex, origNumRow);
    }

    if (perform_basis_postsolve) {
      // if basis is given, expand basis status values to original index space
      undoIterateBackwards(basis.col_status, origColIndex, origNumCol);

      undoIterateBackwards(basis.row_status, origRowIndex, origNumRow);
    }

    // now undo the changes
    for (size_t i = reductions.size(); i > 0; --i) {
      if (report_col >= 0)
        printf("Before  reduction %2d (type %2d): col_value[%2d] = %g\n",
               int(i - 1), int(reductions[i - 1].first), int(report_col),
               solution.col_value[report_col]);
      switch (reductions[i - 1].first) {
        case ReductionType::kLinearTransform: {
          LinearTransform reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution);
          break;
        }
        case ReductionType::kFreeColSubstitution: {
          FreeColSubstitution reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kDoubletonEquation: {
          DoubletonEquation reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAddition: {
          EqualityRowAddition reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAdditions: {
          EqualityRowAdditions reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kSingletonRow: {
          SingletonRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kFixedCol: {
          FixedCol reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kRedundantRow: {
          RedundantRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kForcingRow: {
          ForcingRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumn: {
          ForcingColumn reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumnRemovedRow: {
          ForcingColumnRemovedRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kDuplicateRow: {
          DuplicateRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kDuplicateColumn: {
          DuplicateColumn reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kSlackColSubstitution: {
          SlackColSubstitution reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        default:
          printf("Reduction case %d not handled\n",
                 int(reductions[i - 1].first));
          if (kAllowDeveloperAssert) assert(1 == 0);
      }
    }
    if (report_col >= 0)
      printf("After last reduction: col_value[%2d] = %g\n", int(report_col),
             solution.col_value[report_col]);

#ifdef DEBUG_EXTRA
    // solution should not contain NaN or Inf
    assert(!containsNanOrInf(solution.col_value));
    // row values are not determined by postsolve
    // assert(!containsNanOrInf(solution.row_value));
    assert(!containsNanOrInf(solution.col_dual));
    assert(!containsNanOrInf(solution.row_dual));
#endif
  }